

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O2

void __thiscall TApp_CallbackFlags_Test::~TApp_CallbackFlags_Test(TApp_CallbackFlags_Test *this)

{
  TApp::~TApp(&this->super_TApp);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, CallbackFlags) {

    int value = 0;

    auto func = [&value](size_t x) { value = x; };

    app.add_flag_function("-v", func);

    run();
    EXPECT_EQ(value, 0);

    app.reset();
    args = {"-v"};
    run();
    EXPECT_EQ(value, 1);

    app.reset();
    args = {"-vv"};
    run();
    EXPECT_EQ(value, 2);

    EXPECT_THROW(app.add_flag_function("hi", func), CLI::IncorrectConstruction);
}